

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

RefCntBuffer * assign_cur_frame_new_fb(AV1_COMMON *cm)

{
  int iVar1;
  long in_RDI;
  int new_fb_idx;
  AV1_COMMON *unaff_retaddr;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0xe8) != 0) {
    **(int **)(in_RDI + 0xe8) = **(int **)(in_RDI + 0xe8) + -1;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
  }
  iVar1 = get_free_fb(unaff_retaddr);
  if (iVar1 == -1) {
    local_8 = (RefCntBuffer *)0x0;
  }
  else {
    *(long *)(in_RDI + 0xe8) = *(long *)(*(long *)(in_RDI + 0x62f0) + 0x40) + (long)iVar1 * 0x58e0;
    aom_invalidate_pyramid((ImagePyramid *)0x2302a1);
    av1_invalidate_corner_list((CornerList *)0x2302b9);
    memset((void *)(*(long *)(in_RDI + 0xe8) + 0x5bc),0,0x10);
    local_8 = *(RefCntBuffer **)(in_RDI + 0xe8);
  }
  return local_8;
}

Assistant:

static inline RefCntBuffer *assign_cur_frame_new_fb(AV1_COMMON *const cm) {
  // Release the previously-used frame-buffer
  if (cm->cur_frame != NULL) {
    --cm->cur_frame->ref_count;
    cm->cur_frame = NULL;
  }

  // Assign a new framebuffer
  const int new_fb_idx = get_free_fb(cm);
  if (new_fb_idx == INVALID_IDX) return NULL;

  cm->cur_frame = &cm->buffer_pool->frame_bufs[new_fb_idx];
#if CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
  aom_invalidate_pyramid(cm->cur_frame->buf.y_pyramid);
  av1_invalidate_corner_list(cm->cur_frame->buf.corners);
#endif  // CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
  av1_zero(cm->cur_frame->interp_filter_selected);
  return cm->cur_frame;
}